

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

CTcCodeLabel * __thiscall CTcCodeStream::alloc_label(CTcCodeStream *this)

{
  CTcCodeLabel *pCVar1;
  
  pCVar1 = this->free_lbl_;
  if (pCVar1 == (CTcCodeLabel *)0x0) {
    pCVar1 = (CTcCodeLabel *)CTcPrsMem::alloc((this->super_CTcDataStream).allocator_,0x20);
    pCVar1->nxt = (CTcCodeLabel *)0x0;
    pCVar1->ofs = 0;
    pCVar1->fhead = (CTcLabelFixup *)0x0;
    pCVar1->field_0x18 = pCVar1->field_0x18 & 0xfe;
  }
  else {
    this->free_lbl_ = pCVar1->nxt;
  }
  pCVar1->nxt = this->active_lbl_;
  this->active_lbl_ = pCVar1;
  return pCVar1;
}

Assistant:

CTcCodeLabel *CTcCodeStream::alloc_label()
{
    CTcCodeLabel *ret;
    
    /* if there's anything in the free list, use it */
    if (free_lbl_ != 0)
    {
        /* take the first one off the free list */
        ret = free_lbl_;

        /* unlink it from the list */
        free_lbl_ = free_lbl_->nxt;
    }
    else
    {
        /* allocate a new label */
        ret = new (allocator_) CTcCodeLabel;

        /* throw an error if allocation failed */
        if (ret == 0)
            err_throw(TCERR_CODEGEN_NO_MEM);
    }

    /* add the label to the active list */
    ret->nxt = active_lbl_;
    active_lbl_ = ret;

    /* return the allocated label */
    return ret;
}